

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddImage.c
# Opt level: O1

Extra_ImageTree_t *
Extra_bddImageStart(DdManager *dd,DdNode *bCare,int nParts,DdNode **pbParts,int nVars,
                   DdNode **pbVars,int fVerbose)

{
  size_t __size;
  DdHalfWord DVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  void *pvVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  DdNode *bTemp;
  DdNode *pDVar9;
  DdNode *pDVar10;
  long lVar11;
  void *__ptr;
  undefined8 *puVar12;
  DdNode **ppDVar13;
  ulong uVar14;
  DdNode *pDVar15;
  void *__s;
  DdHalfWord *pDVar16;
  void *__ptr_00;
  Extra_ImageTree_t *pEVar17;
  ulong uVar18;
  Extra_ImageNode_t *pEVar19;
  Extra_ImageNode_t *pEVar20;
  int iVar21;
  uint uVar22;
  DdNode *f;
  size_t __size_00;
  uint uVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  double dVar29;
  double dVar30;
  uint local_48;
  
  if ((fVerbose != 0) && (dd->size < 0x51)) {
    pDVar9 = Cudd_Support(dd,bCare);
    Cudd_Ref(pDVar9);
    pDVar10 = Cudd_bddComputeCube(dd,pbVars,(int *)0x0,nVars);
    Cudd_Ref(pDVar10);
    puts("The latch dependency matrix:");
    printf("Partitions = %d   Variables: total = %d  non-quantifiable = %d\n",(ulong)(uint)nParts,
           (ulong)(uint)dd->size,(ulong)(uint)nVars);
    printf("     : ");
    if (0 < dd->size) {
      uVar22 = 0;
      do {
        printf("%d",(ulong)(uVar22 % 10));
        uVar22 = uVar22 + 1;
      } while ((int)uVar22 < dd->size);
    }
    putchar(10);
    if (0 < nParts) {
      uVar26 = 0;
      do {
        Extra_bddImagePrintLatchDependencyOne(dd,pbParts[uVar26],pDVar9,pDVar10,(int)uVar26);
        uVar26 = uVar26 + 1;
      } while ((uint)nParts != uVar26);
    }
    Extra_bddImagePrintLatchDependencyOne(dd,bCare,pDVar9,pDVar10,nParts);
    Cudd_RecursiveDeref(dd,pDVar9);
    Cudd_RecursiveDeref(dd,pDVar10);
  }
  lVar11 = (long)nParts;
  __size = lVar11 * 8 + 8;
  __ptr = malloc(__size);
  if (0 < nParts) {
    uVar26 = 0;
    do {
      puVar12 = (undefined8 *)malloc(0x18);
      *(undefined8 **)((long)__ptr + uVar26 * 8) = puVar12;
      pDVar9 = pbParts[uVar26];
      *puVar12 = pDVar9;
      Cudd_Ref(pDVar9);
      pDVar9 = Cudd_Support(dd,(DdNode *)*puVar12);
      puVar12[1] = pDVar9;
      Cudd_Ref(pDVar9);
      iVar7 = Extra_bddSuppSize(dd,(DdNode *)puVar12[1]);
      *(short *)((long)puVar12 + 0x14) = (short)iVar7;
      iVar7 = Cudd_DagSize((DdNode *)*puVar12);
      *(int *)(puVar12 + 2) = iVar7;
      *(short *)((long)puVar12 + 0x16) = (short)uVar26;
      uVar26 = uVar26 + 1;
    } while ((uint)nParts != uVar26);
  }
  puVar12 = (undefined8 *)malloc(0x18);
  *(undefined8 **)((long)__ptr + lVar11 * 8) = puVar12;
  *puVar12 = bCare;
  Cudd_Ref(bCare);
  pDVar9 = Cudd_Support(dd,(DdNode *)*puVar12);
  puVar12[1] = pDVar9;
  Cudd_Ref(pDVar9);
  iVar7 = Extra_bddSuppSize(dd,(DdNode *)puVar12[1]);
  *(short *)((long)puVar12 + 0x14) = (short)iVar7;
  iVar7 = Cudd_DagSize((DdNode *)*puVar12);
  *(int *)(puVar12 + 2) = iVar7;
  *(short *)((long)puVar12 + 0x16) = (short)nParts;
  ppDVar13 = (DdNode **)malloc(__size);
  uVar26 = (ulong)(nParts + 1U);
  if (-1 < nParts) {
    uVar14 = 0;
    do {
      ppDVar13[uVar14] = *(DdNode **)(*(long *)((long)__ptr + uVar14 * 8) + 8);
      uVar14 = uVar14 + 1;
    } while (uVar26 != uVar14);
  }
  pDVar9 = Cudd_VectorSupport(dd,ppDVar13,nParts + 1U);
  Cudd_Ref(pDVar9);
  if (ppDVar13 != (DdNode **)0x0) {
    free(ppDVar13);
  }
  pDVar10 = Cudd_bddComputeCube(dd,pbVars,(int *)0x0,nVars);
  Cudd_Ref(pDVar10);
  pDVar15 = Cudd_bddExistAbstract(dd,pDVar9,pDVar10);
  Cudd_Ref(pDVar15);
  Cudd_RecursiveDeref(dd,pDVar9);
  Cudd_RecursiveDeref(dd,pDVar10);
  Extra_bddSuppSize(dd,pDVar15);
  __size_00 = (long)dd->size << 3;
  __s = malloc(__size_00);
  memset(__s,0,__size_00);
  pDVar10 = dd->one;
  pDVar9 = pDVar15;
  if (pDVar15 != pDVar10) {
    do {
      DVar1 = pDVar9->index;
      pDVar16 = (DdHalfWord *)malloc(0x18);
      *(DdHalfWord **)((long)__s + (long)(int)DVar1 * 8) = pDVar16;
      *pDVar16 = DVar1;
      Cudd_Ref(pDVar10);
      if (nParts < 0) {
        iVar7 = 0;
      }
      else {
        uVar14 = 0;
        iVar7 = 0;
        f = pDVar10;
        do {
          iVar8 = Cudd_bddLeq(dd,*(DdNode **)(*(long *)((long)__ptr + uVar14 * 8) + 8),
                              dd->vars[pDVar9->index]);
          pDVar10 = f;
          if (iVar8 != 0) {
            pDVar10 = Cudd_bddAnd(dd,f,dd->vars[uVar14]);
            Cudd_Ref(pDVar10);
            Cudd_RecursiveDeref(dd,f);
            iVar7 = iVar7 + 1;
          }
          uVar14 = uVar14 + 1;
          f = pDVar10;
        } while (uVar26 != uVar14);
      }
      lVar4 = *(long *)((long)__s + (long)(int)DVar1 * 8);
      *(DdNode **)(lVar4 + 8) = pDVar10;
      *(int *)(lVar4 + 0x10) = iVar7;
      pDVar9 = (pDVar9->type).kids.T;
      pDVar10 = dd->one;
    } while (pDVar9 != pDVar10);
  }
  Cudd_RecursiveDeref(dd,pDVar15);
  uVar22 = dd->size;
  __ptr_00 = malloc(__size);
  if (-1 < nParts) {
    uVar14 = 0;
    do {
      puVar12 = (undefined8 *)malloc(0x30);
      *(undefined8 **)((long)__ptr_00 + uVar14 * 8) = puVar12;
      *puVar12 = 0;
      puVar12[1] = 0;
      puVar12[2] = 0;
      puVar12[3] = 0;
      puVar12[4] = 0;
      puVar12[5] = 0;
      *puVar12 = dd;
      puVar12[5] = *(undefined8 *)((long)__ptr + uVar14 * 8);
      uVar14 = uVar14 + 1;
    } while (uVar26 != uVar14);
  }
  if (0 < (int)uVar22) {
    uVar14 = 0;
    do {
      pvVar5 = *(void **)((long)__s + uVar14 * 8);
      if (pvVar5 != (void *)0x0) {
        if (*(int *)((long)pvVar5 + 0x10) < 1) {
          __assert_fail("pVars[v]->nParts > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                        ,0x1c0,
                        "Extra_ImageNode_t **Extra_CreateNodes(DdManager *, int, Extra_ImagePart_t **, int, Extra_ImageVar_t **)"
                       );
        }
        if (*(int *)((long)pvVar5 + 0x10) == 1) {
          lVar4 = *(long *)((long)__ptr_00 + (long)**(int **)((long)pvVar5 + 8) * 8);
          pDVar9 = *(DdNode **)(lVar4 + 8);
          ppDVar13 = dd->vars;
          pDVar10 = ppDVar13[uVar14];
          if (pDVar9 == (DdNode *)0x0) {
            *(DdNode **)(lVar4 + 8) = pDVar10;
            Cudd_Ref(ppDVar13[uVar14]);
          }
          else {
            pDVar10 = Cudd_bddAnd(dd,pDVar9,pDVar10);
            *(DdNode **)(lVar4 + 8) = pDVar10;
            Cudd_Ref(pDVar10);
            Cudd_RecursiveDeref(dd,pDVar9);
          }
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar5 + 8));
          free(pvVar5);
          *(undefined8 *)((long)__s + uVar14 * 8) = 0;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar22 != uVar14);
  }
  if (-1 < nParts) {
    uVar14 = 0;
    do {
      lVar4 = *(long *)((long)__ptr_00 + uVar14 * 8);
      if (*(DdNode **)(lVar4 + 8) != (DdNode *)0x0) {
        puVar12 = *(undefined8 **)((long)__ptr + uVar14 * 8);
        pDVar9 = (DdNode *)*puVar12;
        pDVar10 = Cudd_bddExistAbstract(dd,pDVar9,*(DdNode **)(lVar4 + 8));
        *puVar12 = pDVar10;
        Cudd_Ref(pDVar10);
        Cudd_RecursiveDeref(dd,pDVar9);
        pDVar9 = (DdNode *)puVar12[1];
        pDVar10 = Cudd_bddExistAbstract(dd,pDVar9,*(DdNode **)(lVar4 + 8));
        puVar12[1] = pDVar10;
        Cudd_Ref(pDVar10);
        Cudd_RecursiveDeref(dd,pDVar9);
        iVar7 = Extra_bddSuppSize(dd,(DdNode *)puVar12[1]);
        *(short *)((long)puVar12 + 0x14) = (short)iVar7;
        iVar7 = Cudd_DagSize((DdNode *)*puVar12);
        *(int *)(puVar12 + 2) = iVar7;
        if ((long)uVar14 < lVar11) {
          Cudd_RecursiveDeref(dd,*(DdNode **)(lVar4 + 8));
          *(undefined8 *)(lVar4 + 8) = 0;
        }
      }
      pDVar9 = (DdNode *)**(undefined8 **)((long)__ptr + uVar14 * 8);
      *(DdNode **)(lVar4 + 0x10) = pDVar9;
      Cudd_Ref(pDVar9);
      uVar14 = uVar14 + 1;
    } while (uVar26 != uVar14);
  }
  pEVar17 = (Extra_ImageTree_t *)malloc(0x28);
  pEVar17->pRoot = (Extra_ImageNode_t *)0x0;
  pEVar17->pCare = (Extra_ImageNode_t *)0x0;
  pEVar17->bCareSupp = (DdNode *)0x0;
  pEVar17->fVerbose = 0;
  pEVar17->nNodesMax = 0;
  pEVar17->nNodesMaxT = 0;
  pEVar17->nIter = 0;
  pEVar17->pCare = *(Extra_ImageNode_t **)((long)__ptr_00 + lVar11 * 8);
  pEVar17->fVerbose = fVerbose;
  do {
    iVar7 = dd->size;
    uVar14 = (ulong)iVar7;
    uVar27 = 0xffffffff;
    uVar22 = 0xffffffff;
    if (0 < (long)uVar14) {
      uVar18 = 0;
      dVar29 = 100000000000000.0;
      do {
        lVar11 = *(long *)((long)__s + uVar18 * 8);
        if (lVar11 != 0) {
          dVar30 = 0.0;
          for (pDVar9 = *(DdNode **)(lVar11 + 8); pDVar9 != dd->one; pDVar9 = (pDVar9->type).kids.T)
          {
            iVar8 = *(int *)(*(long *)(*(long *)((long)__ptr_00 + (ulong)pDVar9->index * 8) + 0x28)
                            + 0x10);
            dVar30 = dVar30 + (double)(iVar8 * iVar8);
          }
          if (dVar30 < dVar29) {
            uVar27 = uVar18 & 0xffffffff;
            dVar29 = dVar30;
          }
        }
        uVar22 = (uint)uVar27;
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar14);
    }
    if (uVar22 == 0xffffffff) break;
    lVar11 = (long)(int)uVar22;
    piVar6 = *(int **)((long)__s + lVar11 * 8);
    iVar8 = Extra_bddSuppSize(dd,*(DdNode **)(piVar6 + 2));
    if (iVar8 != piVar6[4]) {
      __assert_fail("nSupp == pVar->nParts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                    ,0x286,
                    "int Extra_BuildTreeNode(DdManager *, int, Extra_ImageNode_t **, int, Extra_ImageVar_t **)"
                   );
    }
    if (iVar8 == 1) {
      __assert_fail("nSupp != 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                    ,0x287,
                    "int Extra_BuildTreeNode(DdManager *, int, Extra_ImageNode_t **, int, Extra_ImageVar_t **)"
                   );
    }
    pDVar9 = *(DdNode **)(piVar6 + 2);
    if (piVar6[4] == 2) {
      local_48 = pDVar9->index;
      uVar23 = ((pDVar9->type).kids.T)->index;
      pEVar19 = *(Extra_ImageNode_t **)((long)__ptr_00 + (long)(int)local_48 * 8);
      pEVar20 = *(Extra_ImageNode_t **)((long)__ptr_00 + (long)(int)uVar23 * 8);
      pDVar9 = dd->vars[*piVar6];
      Cudd_Ref(pDVar9);
      if (0 < iVar7) {
        uVar27 = 0;
        do {
          if (((uVar22 != uVar27) &&
              (piVar6 = *(int **)((long)__s + uVar27 * 8), piVar6 != (int *)0x0)) &&
             (*(long *)(piVar6 + 2) == *(long *)(*(long *)((long)__s + lVar11 * 8) + 8))) {
            pDVar10 = Cudd_bddAnd(dd,pDVar9,dd->vars[*piVar6]);
            Cudd_Ref(pDVar10);
            Cudd_RecursiveDeref(dd,pDVar9);
            pvVar5 = *(void **)((long)__s + uVar27 * 8);
            Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar5 + 8));
            pDVar9 = pDVar10;
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
              *(undefined8 *)((long)__s + uVar27 * 8) = 0;
            }
          }
          uVar27 = uVar27 + 1;
        } while (uVar14 != uVar27);
      }
      pvVar5 = *(void **)((long)__s + lVar11 * 8);
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar5 + 8));
      if (pvVar5 != (void *)0x0) {
        free(pvVar5);
        *(undefined8 *)((long)__s + lVar11 * 8) = 0;
      }
      pEVar19 = Extra_CombineTwoNodes(dd,pDVar9,pEVar19,pEVar20);
      Cudd_RecursiveDeref(dd,pDVar9);
    }
    else {
      if (dd->one == pDVar9) {
        local_48 = 0xffffffff;
        uVar23 = 0xffffffff;
      }
      else {
        local_48 = 0xffffffff;
        iVar8 = 1000000;
        iVar24 = 1000000;
        uVar28 = 0xffffffff;
        do {
          uVar2 = pDVar9->index;
          iVar3 = *(int *)(*(long *)(*(long *)((long)__ptr_00 + (ulong)uVar2 * 8) + 0x28) + 0x10);
          iVar25 = iVar3;
          iVar21 = iVar8;
          uVar23 = local_48;
          if (iVar8 <= iVar3) {
            uVar23 = uVar28;
            if (iVar3 < iVar24) {
              uVar23 = uVar2;
            }
            iVar25 = iVar8;
            iVar21 = iVar3;
            uVar2 = local_48;
            if (iVar24 < iVar3) {
              iVar21 = iVar24;
            }
          }
          local_48 = uVar2;
          pDVar9 = (pDVar9->type).kids.T;
          iVar8 = iVar25;
          iVar24 = iVar21;
          uVar28 = uVar23;
        } while (pDVar9 != dd->one);
      }
      pEVar19 = *(Extra_ImageNode_t **)((long)__ptr_00 + (long)(int)local_48 * 8);
      pEVar20 = *(Extra_ImageNode_t **)((long)__ptr_00 + (long)(int)uVar23 * 8);
      pDVar9 = Cudd_bddAnd(dd,dd->vars[(int)local_48],dd->vars[(int)uVar23]);
      Cudd_Ref(pDVar9);
      if (0 < iVar7) {
        uVar27 = 0;
        do {
          lVar11 = *(long *)((long)__s + uVar27 * 8);
          if ((lVar11 != 0) && (*(DdNode **)(lVar11 + 8) == pDVar9)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                          ,0x2b3,
                          "int Extra_BuildTreeNode(DdManager *, int, Extra_ImageNode_t **, int, Extra_ImageVar_t **)"
                         );
          }
          uVar27 = uVar27 + 1;
        } while (uVar14 != uVar27);
      }
      Cudd_RecursiveDeref(dd,pDVar9);
      pEVar19 = Extra_CombineTwoNodes(dd,dd->one,pEVar19,pEVar20);
    }
    *(Extra_ImageNode_t **)((long)__ptr_00 + (long)(int)local_48 * 8) = pEVar19;
    lVar11 = (long)(int)uVar23;
    *(undefined8 *)((long)__ptr_00 + lVar11 * 8) = 0;
    pDVar9 = pEVar20->pPart->bSupp;
    if (pDVar9 != dd->one) {
      do {
        lVar4 = *(long *)((long)__s + (ulong)pDVar9->index * 8);
        if (lVar4 != 0) {
          iVar7 = Cudd_bddLeq(dd,*(DdNode **)(lVar4 + 8),dd->vars[lVar11]);
          if (iVar7 == 0) {
            __assert_fail("Cudd_bddLeq( dd, pVar->bParts, dd->vars[iNode2] )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                          ,0x2c5,
                          "int Extra_BuildTreeNode(DdManager *, int, Extra_ImageNode_t **, int, Extra_ImageVar_t **)"
                         );
          }
          pDVar10 = *(DdNode **)(lVar4 + 8);
          pDVar15 = Cudd_bddExistAbstract(dd,pDVar10,dd->vars[lVar11]);
          *(DdNode **)(lVar4 + 8) = pDVar15;
          Cudd_Ref(pDVar15);
          Cudd_RecursiveDeref(dd,pDVar10);
          pDVar10 = *(DdNode **)(lVar4 + 8);
          pDVar15 = Cudd_bddAnd(dd,pDVar10,dd->vars[(int)local_48]);
          *(DdNode **)(lVar4 + 8) = pDVar15;
          Cudd_Ref(pDVar15);
          Cudd_RecursiveDeref(dd,pDVar10);
          iVar7 = Extra_bddSuppSize(dd,*(DdNode **)(lVar4 + 8));
          *(int *)(lVar4 + 0x10) = iVar7;
        }
        pDVar9 = (pDVar9->type).kids.T;
      } while (pDVar9 != dd->one);
    }
  } while (uVar22 != 0xffffffff);
  if (0 < (long)dd->size) {
    lVar11 = 0;
    do {
      if (*(long *)((long)__s + lVar11 * 8) != 0) {
        __assert_fail("pVars[v] == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                      ,0xba,
                      "Extra_ImageTree_t *Extra_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int)"
                     );
      }
      lVar11 = lVar11 + 1;
    } while (dd->size != lVar11);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  do {
    iVar7 = -1;
    if (-1 < nParts) {
      uVar14 = 0;
      do {
        if (*(long *)((long)__ptr_00 + uVar14 * 8) != 0) {
          if (iVar7 != -1) goto LAB_007acf95;
          iVar7 = (int)uVar14;
        }
        uVar14 = uVar14 + 1;
      } while (uVar26 != uVar14);
    }
    uVar14 = 0xffffffff;
LAB_007acf95:
    if (iVar7 == -1) {
      __assert_fail("n1 != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                    ,0x2ef,
                    "Extra_ImageNode_t *Extra_MergeTopNodes(DdManager *, int, Extra_ImageNode_t **)"
                   );
    }
    if ((int)uVar14 == -1) {
      lVar11 = (long)iVar7;
      pEVar20 = *(Extra_ImageNode_t **)((long)__ptr_00 + lVar11 * 8);
    }
    else {
      lVar11 = (long)(int)uVar14;
      pEVar20 = Extra_CombineTwoNodes
                          (dd,dd->one,*(Extra_ImageNode_t **)((long)__ptr_00 + (long)iVar7 * 8),
                           *(Extra_ImageNode_t **)((long)__ptr_00 + lVar11 * 8));
      *(Extra_ImageNode_t **)((long)__ptr_00 + (long)iVar7 * 8) = pEVar20;
      pEVar20 = (Extra_ImageNode_t *)0x0;
    }
    *(undefined8 *)(lVar11 * 8 + (long)__ptr_00) = 0;
    pEVar17->pRoot = pEVar20;
    if (pEVar20 != (Extra_ImageNode_t *)0x0) {
      if (-1 < nParts) {
        uVar14 = 0;
        do {
          if (*(long *)((long)__ptr_00 + uVar14 * 8) != 0) {
            __assert_fail("pNodes[v] == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddImage.c"
                          ,0xc2,
                          "Extra_ImageTree_t *Extra_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int)"
                         );
          }
          uVar14 = uVar14 + 1;
        } while (uVar26 != uVar14);
      }
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
      pDVar9 = Cudd_Support(dd,bCare);
      pEVar17->bCareSupp = pDVar9;
      Cudd_Ref(pDVar9);
      Extra_DeleteParts_rec(pEVar20);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      return pEVar17;
    }
  } while( true );
}

Assistant:

Extra_ImageTree_t * Extra_bddImageStart( 
    DdManager * dd, DdNode * bCare, // the care set
    int nParts, DdNode ** pbParts,  // the partitions for image computation
    int nVars, DdNode ** pbVars, int fVerbose )   // the NS and parameter variables (not quantified!)
{
    Extra_ImageTree_t * pTree;
    Extra_ImagePart_t ** pParts;
    Extra_ImageVar_t ** pVars;
    Extra_ImageNode_t ** pNodes;
    int v;

    if ( fVerbose && dd->size <= 80 )
        Extra_bddImagePrintLatchDependency( dd, bCare, nParts, pbParts, nVars, pbVars );

    // create variables, partitions and leaf nodes
    pParts = Extra_CreateParts( dd, nParts, pbParts, bCare );
    pVars  = Extra_CreateVars( dd, nParts + 1, pParts, nVars, pbVars );
    pNodes = Extra_CreateNodes( dd, nParts + 1, pParts, dd->size, pVars );
    
    // create the tree
    pTree = ABC_ALLOC( Extra_ImageTree_t, 1 );
    memset( pTree, 0, sizeof(Extra_ImageTree_t) );
    pTree->pCare = pNodes[nParts];
    pTree->fVerbose = fVerbose;

    // process the nodes
    while ( Extra_BuildTreeNode( dd, nParts + 1, pNodes, dd->size, pVars ) );

    // make sure the variables are gone
    for ( v = 0; v < dd->size; v++ )
        assert( pVars[v] == NULL );
    ABC_FREE( pVars );

    // merge the topmost nodes
    while ( (pTree->pRoot = Extra_MergeTopNodes( dd, nParts + 1, pNodes )) == NULL );

    // make sure the nodes are gone
    for ( v = 0; v < nParts + 1; v++ )
        assert( pNodes[v] == NULL );
    ABC_FREE( pNodes );

//    if ( fVerbose )
//        Extra_bddImagePrintTree( pTree );

    // set the support of the care set
    pTree->bCareSupp = Cudd_Support( dd, bCare );  Cudd_Ref( pTree->bCareSupp );

    // clean the partitions
    Extra_DeleteParts_rec( pTree->pRoot );
    ABC_FREE( pParts );
    return pTree;
}